

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall FxGetClass::FxGetClass(FxGetClass *this,FxExpression *self)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_GetClass,&self->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxGetClass_00706d08;
  this->Self = self;
  return;
}

Assistant:

FxGetClass::FxGetClass(FxExpression *self)
	:FxExpression(EFX_GetClass, self->ScriptPosition)
{
	Self = self;
}